

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O0

int cvGlocWrapper(sunindextype NlocalB,sunrealtype t,N_Vector yB,N_Vector gB,void *cvode_mem)

{
  CVadjMemRec *pCVar1;
  CVodeBMemRec *pCVar2;
  undefined8 *puVar3;
  int iVar4;
  CVodeMem in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype in_XMM0_Qa;
  int flag;
  CVBBDPrecDataB cvbbdB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  int local_4;
  
  pCVar1 = in_RCX->cv_adj_mem;
  pCVar2 = pCVar1->ca_bckpbCrt;
  puVar3 = (undefined8 *)pCVar2->cv_pmem;
  iVar4 = (*pCVar1->ca_IMget)(in_RCX,in_XMM0_Qa,pCVar1->ca_ytmp,(N_Vector *)0x0);
  if (iVar4 == 0) {
    local_4 = (*(code *)*puVar3)(in_XMM0_Qa,in_RDI,pCVar1->ca_ytmp,in_RSI,in_RDX,
                                 pCVar2->cv_user_data);
  }
  else {
    cvProcessError(in_RCX,-1,0x396,"cvGlocWrapper",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Bad t for interpolation.");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int cvGlocWrapper(sunindextype NlocalB, sunrealtype t, N_Vector yB,
                         N_Vector gB, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVBBDPrecDataB cvbbdB_mem;
  int flag;

  cv_mem     = (CVodeMem)cvode_mem;
  ca_mem     = cv_mem->cv_adj_mem;
  cvB_mem    = ca_mem->ca_bckpbCrt;
  cvbbdB_mem = (CVBBDPrecDataB)(cvB_mem->cv_pmem);

  /* Get forward solution from interpolation */
  flag = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (flag != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint glocB routine */
  return cvbbdB_mem->glocB(NlocalB, t, ca_mem->ca_ytmp, yB, gB,
                           cvB_mem->cv_user_data);
}